

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbpl_bfs_2d.h
# Opt level: O0

bool __thiscall sbpl_bfs_2d::compute_distance_from_point(sbpl_bfs_2d *this,int **grid,int x,int y)

{
  bfs_cell_2d val;
  int in_ECX;
  int in_EDX;
  sbpl_bfs_2d *in_RDI;
  bfs_cell_2d c;
  int local_28;
  int in_stack_ffffffffffffffdc;
  bool local_1;
  
  if ((((in_EDX < 0) || (in_RDI->size_x_ <= in_EDX)) || (in_ECX < 0)) || (in_RDI->size_y_ <= in_ECX)
     ) {
    printf("ERROR[compute_distance_from_point]: point is out of bounds!\n");
    local_1 = false;
  }
  else {
    sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d>::clear(in_RDI->q_);
    clear_distances(in_RDI);
    bfs_cell_2d::bfs_cell_2d((bfs_cell_2d *)&local_28,in_EDX,in_ECX);
    val.y = in_ECX;
    val.x = in_stack_ffffffffffffffdc;
    sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d>::insert
              ((sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *)CONCAT44(in_stack_ffffffffffffffdc,local_28),
               val);
    in_RDI->dist_[in_EDX][in_ECX] = 0;
    compute_distances((sbpl_bfs_2d *)grid,(int **)CONCAT44(x,y));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool compute_distance_from_point(int** grid, int x, int y)
    {
        if (x < 0 || x >= size_x_ || y < 0 || y >= size_y_) {
            printf("ERROR[compute_distance_from_point]: point is out of bounds!\n");
            return false;
        }
        q_->clear();
        clear_distances();

        bfs_cell_2d c(x, y);
        q_->insert(c);
        dist_[x][y] = 0;

        compute_distances(grid);
        return true;
    }